

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_memory_writer_example.cpp
# Opt level: O1

int main(void)

{
  bool bVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  int counter;
  int iVar5;
  stringstream local_2b8 [8];
  stringstream ss;
  ostream local_2a8 [112];
  ios_base local_238 [264];
  undefined1 local_130 [8];
  MySharedMemory sharedMemory;
  long local_d0;
  long local_c8 [2];
  size_type *local_b8;
  string message_start;
  long local_88 [2];
  void *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  size_type *local_50;
  string message;
  
  sharedMemory.error_message.field_2._8_8_ = local_c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&sharedMemory.error_message.field_2 + 8),"shared_memory_example","");
  local_130 = (undefined1  [8])&sharedMemory.key._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_130,sharedMemory.error_message.field_2._8_8_,
             local_d0 + sharedMemory.error_message.field_2._8_8_);
  sharedMemory.sem = (sem_t *)&sharedMemory.error_message._M_string_length;
  sharedMemory.key.field_2._8_8_ = 0;
  sharedMemory.addr = (void *)0x0;
  sharedMemory.mapping_size = 0;
  sharedMemory.error_message._M_dataplus._M_p = (pointer)0x0;
  sharedMemory.error_message._M_string_length._0_1_ = 0;
  if ((long *)sharedMemory.error_message.field_2._8_8_ != local_c8) {
    operator_delete((void *)sharedMemory.error_message.field_2._8_8_,local_c8[0] + 1);
  }
  bVar1 = MySharedMemory::create((MySharedMemory *)local_130,0x1000);
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)sharedMemory.sem,
               (long)sharedMemory.error_message._M_dataplus._M_p);
    MySharedMemory::~MySharedMemory((MySharedMemory *)local_130);
    return 1;
  }
  local_78 = MySharedMemory::data((MySharedMemory *)local_130);
  local_b8 = &message_start._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Message number: ","");
  iVar5 = 0;
  do {
    MySharedMemory::lock((MySharedMemory *)local_130);
    std::__cxx11::stringstream::stringstream(local_2b8);
    std::ostream::operator<<(local_2a8,iVar5);
    std::__cxx11::stringbuf::str();
    plVar2 = (long *)std::__cxx11::string::replace
                               ((ulong)((long)&message_start.field_2 + 8),0,(char *)0x0,
                                (ulong)local_b8);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_60 = *plVar3;
      lStack_58 = plVar2[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar3;
      local_70 = (long *)*plVar2;
    }
    local_68 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
    psVar4 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar4) {
      message._M_string_length = *psVar4;
      message.field_2._M_allocated_capacity = plVar2[3];
      local_50 = &message._M_string_length;
    }
    else {
      message._M_string_length = *psVar4;
      local_50 = (size_type *)*plVar2;
    }
    message._M_dataplus._M_p = (pointer)plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if ((long *)message_start.field_2._8_8_ != local_88) {
      operator_delete((void *)message_start.field_2._8_8_,local_88[0] + 1);
    }
    if (message._M_dataplus._M_p + 1 != (pointer)0x0) {
      memmove(local_78,local_50,(size_t)(message._M_dataplus._M_p + 1));
    }
    MySharedMemory::unlock((MySharedMemory *)local_130);
    if (local_50 != &message._M_string_length) {
      operator_delete(local_50,message._M_string_length + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_2b8);
    std::ios_base::~ios_base(local_238);
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

int main() {
    size_t size = 4096;

    MySharedMemory sharedMemory("shared_memory_example");
    bool res = sharedMemory.create(size);
    if (!res) {
        std::cout << sharedMemory.error_message;
        return 1;
    }

    char *data = (char *)sharedMemory.data();

    std::string message_start = "Message number: ";
    for(int counter = 0;; ++counter) {
        sharedMemory.lock();

        std::stringstream ss;
        ss << counter;

        std::string message = message_start + ss.str() + "\n";
        std::copy(&message[0], &message[0] + message.size() + 1, data);

        sharedMemory.unlock();
    }

    return 0;
}